

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

ImU32 ImGui::TabBarCalcTabID(ImGuiTabBar *tab_bar,char *label)

{
  ImGuiID IVar1;
  ImU32 id;
  
  if (((uint)tab_bar >> 0x14 & 1) == 0) {
    IVar1 = ImGuiWindow::GetID(GImGui->CurrentWindow,label,(char *)0x0);
    return IVar1;
  }
  id = ImHashStr(label,0,0);
  KeepAliveID(id);
  return id;
}

Assistant:

static ImU32   ImGui::TabBarCalcTabID(ImGuiTabBar* tab_bar, const char* label)
{
    if (tab_bar->Flags & ImGuiTabBarFlags_DockNode)
    {
        ImGuiID id = ImHashStr(label);
        KeepAliveID(id);
        return id;
    }
    else
    {
        ImGuiWindow* window = GImGui->CurrentWindow;
        return window->GetID(label);
    }
}